

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScaleProcess.cpp
# Opt level: O3

void __thiscall Assimp::ScaleProcess::Execute(ScaleProcess *this,aiScene *pScene)

{
  undefined8 uVar1;
  aiAnimation *paVar2;
  aiNodeAnim *paVar3;
  aiVectorKey *paVar4;
  aiMesh *paVar5;
  aiVector3D *paVar6;
  aiAnimMesh *paVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  aiQuaterniont<float> aVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  aiVector3t<float> local_98;
  aiVector3t<float> local_88;
  aiQuaterniont<float> local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  aiScene *local_48;
  ulong local_40;
  aiBone *local_38;
  
  fVar15 = this->mScale;
  if ((fVar15 != 1.0) || (NAN(fVar15))) {
    if ((fVar15 == 0.0) && (!NAN(fVar15))) {
      __assert_fail("mScale != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/ScaleProcess.cpp"
                    ,0x58,"virtual void Assimp::ScaleProcess::Execute(aiScene *)");
    }
    if (pScene == (aiScene *)0x0) {
      __assert_fail("nullptr != pScene",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/ScaleProcess.cpp"
                    ,0x59,"virtual void Assimp::ScaleProcess::Execute(aiScene *)");
    }
    if (pScene->mRootNode == (aiNode *)0x0) {
      __assert_fail("nullptr != pScene->mRootNode",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/ScaleProcess.cpp"
                    ,0x5a,"virtual void Assimp::ScaleProcess::Execute(aiScene *)");
    }
    uVar9 = (ulong)pScene->mNumAnimations;
    if (pScene->mNumAnimations != 0) {
      uVar8 = 0;
      do {
        paVar2 = pScene->mAnimations[uVar8];
        uVar12 = (ulong)paVar2->mNumChannels;
        if (paVar2->mNumChannels != 0) {
          uVar9 = 0;
          do {
            paVar3 = paVar2->mChannels[uVar9];
            if (paVar3->mNumPositionKeys != 0) {
              lVar11 = 0x10;
              uVar12 = 0;
              do {
                paVar4 = paVar3->mPositionKeys;
                fVar15 = this->mScale;
                uVar1 = *(undefined8 *)((long)paVar4 + lVar11 + -8);
                *(ulong *)((long)paVar4 + lVar11 + -8) =
                     CONCAT44(fVar15 * (float)((ulong)uVar1 >> 0x20),fVar15 * (float)uVar1);
                *(float *)((long)&paVar4->mTime + lVar11) =
                     fVar15 * *(float *)((long)&paVar4->mTime + lVar11);
                uVar12 = uVar12 + 1;
                lVar11 = lVar11 + 0x18;
              } while (uVar12 < paVar3->mNumPositionKeys);
              uVar12 = (ulong)paVar2->mNumChannels;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 < uVar12);
          uVar9 = (ulong)pScene->mNumAnimations;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < uVar9);
    }
    if (pScene->mNumMeshes != 0) {
      aVar18._0_12_ = ZEXT812(0x3f800000);
      aVar18.z = 0.0;
      uVar9 = 0;
      local_48 = pScene;
      do {
        paVar5 = local_48->mMeshes[uVar9];
        if (paVar5->mNumVertices != 0) {
          lVar11 = 8;
          uVar8 = 0;
          do {
            paVar6 = paVar5->mVertices;
            fVar15 = this->mScale;
            uVar1 = *(undefined8 *)((long)paVar6 + lVar11 + -8);
            *(ulong *)((long)paVar6 + lVar11 + -8) =
                 CONCAT44(fVar15 * (float)((ulong)uVar1 >> 0x20),fVar15 * (float)uVar1);
            *(float *)((long)&paVar6->x + lVar11) = fVar15 * *(float *)((long)&paVar6->x + lVar11);
            uVar8 = uVar8 + 1;
            lVar11 = lVar11 + 0xc;
          } while (uVar8 < paVar5->mNumVertices);
        }
        local_40 = uVar9;
        if (paVar5->mNumBones != 0) {
          uVar9 = 0;
          do {
            local_38 = paVar5->mBones[uVar9];
            local_88.x = 0.0;
            local_88.y = 0.0;
            local_88.z = 0.0;
            local_98.x = 0.0;
            local_98.y = 0.0;
            local_98.z = 0.0;
            local_78 = aVar18;
            aiMatrix4x4t<float>::Decompose(&local_38->mOffsetMatrix,&local_98,&local_78,&local_88);
            fVar15 = this->mScale;
            fVar25 = local_78.x * local_78.z + local_78.y * local_78.w;
            fVar17 = local_78.y * local_78.y + local_78.z * local_78.z;
            fVar16 = local_78.x * local_78.y + local_78.z * local_78.w;
            fVar16 = fVar16 + fVar16;
            fVar22 = local_78.x * local_78.z - local_78.y * local_78.w;
            fVar25 = fVar25 + fVar25;
            fVar26 = local_78.y * local_78.z - local_78.w * local_78.x;
            fVar22 = fVar22 + fVar22;
            fVar26 = fVar26 + fVar26;
            fVar14 = local_78.w * local_78.x + local_78.y * local_78.z;
            fVar14 = fVar14 + fVar14;
            fVar33 = fVar16 * 0.0;
            fVar19 = 1.0 - (fVar17 + fVar17);
            fVar32 = fVar22 * 0.0;
            fVar31 = (local_78.z * local_78.z + local_78.x * local_78.x) * -2.0 + 1.0;
            fVar17 = fVar31 * 0.0;
            fVar13 = (-local_78.z * local_78.w + local_78.y * local_78.x) * 2.0;
            fVar20 = fVar19 * 0.0;
            fVar21 = fVar20 + fVar33;
            fVar29 = fVar26 * 0.0;
            fVar23 = fVar13 * 0.0;
            fVar24 = fVar23 + fVar17;
            fVar30 = local_88.x * fVar15 * 0.0;
            fVar27 = (local_78.x * local_78.x + local_78.y * local_78.y) * -2.0 + 1.0;
            fVar28 = fVar29 + fVar25 * 0.0;
            fVar19 = fVar19 + fVar33 + fVar32 + fVar30;
            fVar34 = fVar14 * 0.0;
            fVar33 = fVar17 + fVar13 + fVar34 + fVar30;
            fVar17 = fVar27 * 0.0;
            fVar30 = fVar25 + fVar29 + fVar17 + fVar30;
            fVar29 = local_88.y * fVar15 * 0.0;
            fVar16 = fVar16 + fVar20 + fVar32 + fVar29;
            fVar31 = fVar31 + fVar23 + fVar34 + fVar29;
            fVar29 = fVar25 * 0.0 + fVar26 + fVar17 + fVar29;
            fVar23 = fVar15 * local_88.z;
            local_58 = ZEXT416((uint)fVar23);
            fVar32 = fVar21 + fVar32;
            local_68 = ZEXT416((uint)fVar32);
            fVar13 = fVar23 * 0.0;
            fVar21 = fVar22 + fVar21 + fVar13;
            fVar25 = fVar27 + fVar28 + fVar13;
            fVar13 = fVar14 + fVar24 + fVar13;
            fVar26 = fVar33 * 0.0;
            fVar20 = fVar19 * 0.0 + fVar26;
            fVar27 = fVar30 * 0.0;
            fVar22 = local_88.x * fVar15 + 0.0;
            fVar14 = fVar22 * 0.0;
            (local_38->mOffsetMatrix).a1 = fVar14 + fVar27 + fVar19 * local_98.x + fVar26;
            (local_38->mOffsetMatrix).a2 = fVar14 + fVar27 + fVar19 * 0.0 + fVar33 * local_98.y;
            (local_38->mOffsetMatrix).a3 = local_98.z * fVar30 + fVar20 + fVar14;
            fVar26 = fVar31 * 0.0;
            fVar14 = fVar16 * 0.0 + fVar26;
            fVar19 = fVar29 * 0.0;
            (local_38->mOffsetMatrix).a4 = fVar20 + fVar27 + fVar22;
            fVar27 = local_88.y * fVar15 + 0.0;
            fVar30 = fVar27 * 0.0;
            (local_38->mOffsetMatrix).b1 = fVar30 + fVar19 + fVar16 * local_98.x + fVar26;
            (local_38->mOffsetMatrix).b2 = fVar30 + fVar19 + fVar16 * 0.0 + fVar31 * local_98.y;
            fVar20 = fVar24 + fVar34 + 0.0;
            fVar22 = fVar20 * 0.0;
            fVar15 = fVar13 * 0.0;
            (local_38->mOffsetMatrix).b3 = local_98.z * fVar29 + fVar14 + fVar30;
            (local_38->mOffsetMatrix).b4 = fVar14 + fVar19 + fVar27;
            fVar32 = fVar32 + 0.0;
            fVar19 = (fVar23 + 0.0) * 0.0;
            fVar14 = fVar15 + fVar21 * 0.0;
            fVar16 = fVar22 + fVar32 * 0.0;
            fVar17 = fVar28 + fVar17 + 0.0;
            (local_38->mOffsetMatrix).c1 = fVar19 + fVar25 * 0.0 + fVar21 * local_98.x + fVar15;
            (local_38->mOffsetMatrix).c2 =
                 fVar19 + fVar25 * 0.0 + fVar21 * 0.0 + fVar13 * local_98.y;
            (local_38->mOffsetMatrix).c3 = local_98.z * fVar25 + fVar14 + fVar19;
            (local_38->mOffsetMatrix).c4 = fVar23 + 0.0 + fVar25 * 0.0 + fVar14;
            (local_38->mOffsetMatrix).d1 = fVar17 * 0.0 + fVar22 + fVar32 * local_98.x + 0.0;
            (local_38->mOffsetMatrix).d2 = fVar17 * 0.0 + fVar20 * local_98.y + fVar32 * 0.0 + 0.0;
            (local_38->mOffsetMatrix).d3 = fVar17 * local_98.z + fVar16 + 0.0;
            aVar18._0_12_ = ZEXT812(0x3f800000);
            aVar18.z = 0.0;
            (local_38->mOffsetMatrix).d4 = fVar17 * 0.0 + fVar16 + 1.0;
            uVar9 = uVar9 + 1;
          } while (uVar9 < paVar5->mNumBones);
        }
        uVar10 = paVar5->mNumAnimMeshes;
        if (uVar10 != 0) {
          uVar9 = 0;
          do {
            paVar7 = paVar5->mAnimMeshes[uVar9];
            if (paVar7->mNumVertices != 0) {
              lVar11 = 8;
              uVar8 = 0;
              do {
                paVar6 = paVar7->mVertices;
                fVar15 = this->mScale;
                uVar1 = *(undefined8 *)((long)paVar6 + lVar11 + -8);
                *(ulong *)((long)paVar6 + lVar11 + -8) =
                     CONCAT44(fVar15 * (float)((ulong)uVar1 >> 0x20),fVar15 * (float)uVar1);
                *(float *)((long)&paVar6->x + lVar11) =
                     fVar15 * *(float *)((long)&paVar6->x + lVar11);
                uVar8 = uVar8 + 1;
                lVar11 = lVar11 + 0xc;
              } while (uVar8 < paVar7->mNumVertices);
              uVar10 = paVar5->mNumAnimMeshes;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 < uVar10);
        }
        uVar9 = local_40 + 1;
        pScene = local_48;
      } while (uVar9 < local_48->mNumMeshes);
    }
    traverseNodes(this,pScene->mRootNode,0);
  }
  return;
}

Assistant:

void ScaleProcess::Execute( aiScene* pScene ) {
    if(mScale == 1.0f)  {
        return; // nothing to scale
    }
    
    ai_assert( mScale != 0 );
    ai_assert( nullptr != pScene );
    ai_assert( nullptr != pScene->mRootNode );

    if ( nullptr == pScene ) {
        return;
    }

    if ( nullptr == pScene->mRootNode ) {
        return;
    }
    
    // Process animations and update position transform to new unit system
    for( unsigned int animationID = 0; animationID < pScene->mNumAnimations; animationID++ )
    {
        aiAnimation* animation = pScene->mAnimations[animationID];

        for( unsigned int animationChannel = 0; animationChannel < animation->mNumChannels; animationChannel++)
        {
            aiNodeAnim* anim = animation->mChannels[animationChannel];
            
            for( unsigned int posKey = 0; posKey < anim->mNumPositionKeys; posKey++)
            {
                aiVectorKey& vectorKey = anim->mPositionKeys[posKey];
                vectorKey.mValue *= mScale;
            }
        }
    }

    for( unsigned int meshID = 0; meshID < pScene->mNumMeshes; meshID++)
    {
        aiMesh *mesh = pScene->mMeshes[meshID]; 
        
        // Reconstruct mesh vertexes to the new unit system
        for( unsigned int vertexID = 0; vertexID < mesh->mNumVertices; vertexID++)
        {
            aiVector3D& vertex = mesh->mVertices[vertexID];
            vertex *= mScale;
        }


        // bone placement / scaling
        for( unsigned int boneID = 0; boneID < mesh->mNumBones; boneID++)
        {
            // Reconstruct matrix by transform rather than by scale 
            // This prevent scale values being changed which can
            // be meaningful in some cases 
            // like when you want the modeller to see 1:1 compatibility.
            aiBone* bone = mesh->mBones[boneID];

            aiVector3D pos, scale;
            aiQuaternion rotation;

            bone->mOffsetMatrix.Decompose( scale, rotation, pos);
            
            aiMatrix4x4 translation;
            aiMatrix4x4::Translation( pos * mScale, translation );
            
            aiMatrix4x4 scaling;
            aiMatrix4x4::Scaling( aiVector3D(scale), scaling );

            aiMatrix4x4 RotMatrix = aiMatrix4x4 (rotation.GetMatrix());

            bone->mOffsetMatrix = translation * RotMatrix * scaling;
        }


        // animation mesh processing
        // convert by position rather than scale.
        for( unsigned int animMeshID = 0; animMeshID < mesh->mNumAnimMeshes; animMeshID++)
        {
            aiAnimMesh * animMesh = mesh->mAnimMeshes[animMeshID];
            
            for( unsigned int vertexID = 0; vertexID < animMesh->mNumVertices; vertexID++)
            {
                aiVector3D& vertex = animMesh->mVertices[vertexID];
                vertex *= mScale;
            }
        }
    }

    traverseNodes( pScene->mRootNode );
}